

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTEventLog.cpp
# Opt level: O0

void __thiscall
TTD::TTEventList::DeleteFirstEntry(TTEventList *this,TTEventListLink *block,EventLogEntry *data)

{
  fPtr_EventLogEntryInfoUnload p_Var1;
  fPtr_EventLogEntryInfoUnload unloadFP;
  EventLogEntry *data_local;
  TTEventListLink *block_local;
  TTEventList *this_local;
  
  if ((EventLogEntry *)(block->BlockData + block->StartPos) != data) {
    TTDAbort_unrecoverable_error("Not the data at the start of the list!!!");
  }
  p_Var1 = this->m_vtable[data->EventKind].UnloadFP;
  if (p_Var1 != (fPtr_EventLogEntryInfoUnload)0x0) {
    (*p_Var1)(data,this->m_alloc);
  }
  block->StartPos = this->m_vtable[data->EventKind].DataSize + block->StartPos;
  if (block->StartPos == block->CurrPos) {
    RemoveArrayLink(this,block);
  }
  return;
}

Assistant:

void TTEventList::DeleteFirstEntry(TTEventListLink* block, NSLogEvents::EventLogEntry* data)
    {
        TTDAssert(reinterpret_cast<NSLogEvents::EventLogEntry*>(block->BlockData + block->StartPos) == data, "Not the data at the start of the list!!!");

        auto unloadFP = this->m_vtable[(uint32)data->EventKind].UnloadFP; //use vtable magic here

        if(unloadFP != nullptr)
        {
            unloadFP(data, *(this->m_alloc));
        }

        block->StartPos += this->m_vtable[(uint32)data->EventKind].DataSize;
        if(block->StartPos == block->CurrPos)
        {
            this->RemoveArrayLink(block);
        }
    }